

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

void proto2_unittest::TestHugeFieldNumbersLite::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  MessageLite *to_msg_00;
  void *pvVar4;
  _func_int **pp_Var5;
  Arena *pAVar6;
  Arena *extraout_RDX;
  uint unaff_EBP;
  string *psVar7;
  MessageLite *pMVar8;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    psVar7 = (string *)to_msg;
    pMVar8 = from_msg;
    MergeImpl();
    pAVar6 = extraout_RDX;
LAB_00d45b49:
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
LAB_00d4590b:
    google::protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)pMVar8,psVar7,pAVar6);
LAB_00d45910:
    if ((unaff_EBP & 2) != 0) {
      pp_Var5 = from_msg[8]._vptr_MessageLite;
      *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 2;
      pAVar6 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)(to_msg + 8),(string *)((ulong)pp_Var5 & 0xfffffffffffffffc),
                 pAVar6);
    }
    if ((unaff_EBP & 4) != 0) {
      pMVar8 = (MessageLite *)from_msg[8]._internal_metadata_.ptr_;
      if (pMVar8 == (MessageLite *)0x0) {
        MergeImpl((TestHugeFieldNumbersLite *)&stack0xffffffffffffffc8);
        goto LAB_00d45b69;
      }
      to_msg_00 = (MessageLite *)to_msg[8]._internal_metadata_.ptr_;
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar4 = google::protobuf::Arena::CopyConstruct<proto2_unittest::ForeignMessageLite>
                           (arena,pMVar8);
        to_msg[8]._internal_metadata_.ptr_ = (intptr_t)pvVar4;
      }
      else {
        ForeignMessageLite::MergeImpl(to_msg_00,pMVar8);
      }
    }
    if ((unaff_EBP & 8) != 0) {
      pMVar8 = (MessageLite *)from_msg[9]._vptr_MessageLite;
      if (pMVar8 == (MessageLite *)0x0) {
LAB_00d45b69:
        MergeImpl((TestHugeFieldNumbersLite *)&stack0xffffffffffffffc8);
      }
      if ((MessageLite *)to_msg[9]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var5 = (_func_int **)
                  google::protobuf::Arena::
                  CopyConstruct<proto2_unittest::TestHugeFieldNumbersLite_OptionalGroup>
                            (arena,pMVar8);
        to_msg[9]._vptr_MessageLite = pp_Var5;
      }
      else {
        TestHugeFieldNumbersLite_OptionalGroup::MergeImpl
                  ((MessageLite *)to_msg[9]._vptr_MessageLite,pMVar8);
      }
    }
    if ((unaff_EBP & 0x10) != 0) {
      *(int *)&to_msg[9]._internal_metadata_.ptr_ = (int)from_msg[9]._internal_metadata_.ptr_;
    }
    if ((unaff_EBP & 0x20) != 0) {
      *(undefined4 *)((long)&to_msg[9]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[9]._internal_metadata_.ptr_ + 4);
    }
    if ((unaff_EBP & 0x40) != 0) {
      *(undefined4 *)&to_msg[10]._vptr_MessageLite = *(undefined4 *)&from_msg[10]._vptr_MessageLite;
    }
  }
  else {
    google::protobuf::RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)(to_msg + 3),(RepeatedField<int> *)(from_msg + 3));
    google::protobuf::RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)(to_msg + 4),(RepeatedField<int> *)(from_msg + 4));
    google::protobuf::internal::MapMergeFrom<std::__cxx11::string,std::__cxx11::string>
              ((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&to_msg[5]._internal_metadata_,
               (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&from_msg[5]._internal_metadata_);
    unaff_EBP = (uint)from_msg[2]._internal_metadata_.ptr_;
    if ((unaff_EBP & 0x7f) != 0) {
      if ((unaff_EBP & 1) != 0) {
        uVar3 = from_msg[7]._internal_metadata_.ptr_;
        *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 1;
        psVar7 = (string *)(uVar3 & 0xfffffffffffffffc);
        pMVar8 = (MessageLite *)&to_msg[7]._internal_metadata_;
        pAVar6 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar6 & 1) != 0) goto LAB_00d45b49;
        goto LAB_00d4590b;
      }
      goto LAB_00d45910;
    }
  }
  *(uint *)&to_msg[2]._internal_metadata_.ptr_ =
       (uint)to_msg[2]._internal_metadata_.ptr_ | unaff_EBP;
  iVar1 = *(int *)&from_msg[0xb]._vptr_MessageLite;
  if (iVar1 == 0) goto switchD_00d45a37_default;
  iVar2 = *(int *)&to_msg[0xb]._vptr_MessageLite;
  if (iVar2 != iVar1) {
    if (iVar2 != 0) {
      clear_oneof_field((TestHugeFieldNumbersLite *)to_msg);
    }
    *(int *)&to_msg[0xb]._vptr_MessageLite = iVar1;
  }
  switch(iVar1) {
  case 0x1ffffc7b:
    *(int *)&to_msg[10]._internal_metadata_.ptr_ = (int)from_msg[10]._internal_metadata_.ptr_;
    break;
  case 0x1ffffc7c:
    if (iVar2 == iVar1) {
      TestAllTypesLite::MergeImpl
                ((MessageLite *)to_msg[10]._internal_metadata_.ptr_,
                 (MessageLite *)from_msg[10]._internal_metadata_.ptr_);
    }
    else {
      pvVar4 = google::protobuf::Arena::CopyConstruct<proto2_unittest::TestAllTypesLite>
                         (arena,(void *)from_msg[10]._internal_metadata_.ptr_);
      to_msg[10]._internal_metadata_.ptr_ = (intptr_t)pvVar4;
    }
    break;
  case 0x1ffffc7d:
    if (iVar2 != iVar1) {
      to_msg[10]._internal_metadata_.ptr_ =
           (intptr_t)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)&from_msg[0xb]._vptr_MessageLite == 0x1ffffc7d) goto LAB_00d45a9f;
LAB_00d45a6f:
    psVar7 = (string *)&google::protobuf::internal::fixed_address_empty_string;
    goto LAB_00d45aaa;
  case 0x1ffffc7e:
    if (iVar2 != iVar1) {
      to_msg[10]._internal_metadata_.ptr_ =
           (intptr_t)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)&from_msg[0xb]._vptr_MessageLite != 0x1ffffc7e) goto LAB_00d45a6f;
LAB_00d45a9f:
    psVar7 = (string *)(from_msg[10]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
LAB_00d45aaa:
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[10]._internal_metadata_,psVar7,arena);
  }
switchD_00d45a37_default:
  google::protobuf::internal::ExtensionSet::MergeFrom
            ((ExtensionSet *)(to_msg + 1),(MessageLite *)_TestHugeFieldNumbersLite_default_instance_
             ,(ExtensionSet *)(from_msg + 1));
  uVar3 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&to_msg->_internal_metadata_,(string *)((uVar3 & 0xfffffffffffffffe) + 8));
    return;
  }
  return;
}

Assistant:

void TestHugeFieldNumbersLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestHugeFieldNumbersLite*>(&to_msg);
  auto& from = static_cast<const TestHugeFieldNumbersLite&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestHugeFieldNumbersLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_mutable_packed_int32()->MergeFrom(from._internal_packed_int32());
  _this->_impl_.string_string_map_.MergeFrom(from._impl_.string_string_map_);
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_optional_string(from._internal_optional_string());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_optional_bytes(from._internal_optional_bytes());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.optional_message_ != nullptr);
      if (_this->_impl_.optional_message_ == nullptr) {
        _this->_impl_.optional_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_message_);
      } else {
        _this->_impl_.optional_message_->MergeFrom(*from._impl_.optional_message_);
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.optionalgroup_ != nullptr);
      if (_this->_impl_.optionalgroup_ == nullptr) {
        _this->_impl_.optionalgroup_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optionalgroup_);
      } else {
        _this->_impl_.optionalgroup_->MergeFrom(*from._impl_.optionalgroup_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.optional_int32_ = from._impl_.optional_int32_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.fixed_32_ = from._impl_.fixed_32_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.optional_enum_ = from._impl_.optional_enum_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_field();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofUint32: {
        _this->_impl_.oneof_field_.oneof_uint32_ = from._impl_.oneof_field_.oneof_uint32_;
        break;
      }
      case kOneofTestAllTypes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_test_all_types_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_test_all_types_);
        } else {
          _this->_impl_.oneof_field_.oneof_test_all_types_->MergeFrom(*from._impl_.oneof_field_.oneof_test_all_types_);
        }
        break;
      }
      case kOneofString: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_.Set(from._internal_oneof_string(), arena);
        break;
      }
      case kOneofBytes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_.Set(from._internal_oneof_bytes(), arena);
        break;
      }
      case ONEOF_FIELD_NOT_SET:
        break;
    }
  }
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}